

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ssize_t __thiscall
Json::BuiltStyledStreamWriter::write(BuiltStyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  Value *root;
  ostream *sout_local;
  Value *root_local;
  BuiltStyledStreamWriter *this_local;
  
  root = (Value *)CONCAT44(in_register_00000034,__fd);
  (this->super_StreamWriter).sout_ = (ostream *)__buf;
  this->field_0xd8 = this->field_0xd8 & 0xfe;
  this->field_0xd8 = this->field_0xd8 & 0xfd | 2;
  std::__cxx11::string::clear();
  writeCommentBeforeValue(this,root);
  if (((byte)this->field_0xd8 >> 1 & 1) == 0) {
    writeIndent(this);
  }
  this->field_0xd8 = this->field_0xd8 & 0xfd | 2;
  writeValue(this,root);
  writeCommentAfterValueOnSameLine(this,root);
  std::operator<<((this->super_StreamWriter).sout_,(string *)&this->endingLineFeedSymbol_);
  (this->super_StreamWriter).sout_ = (ostream *)0x0;
  return 0;
}

Assistant:

int BuiltStyledStreamWriter::write(Value const& root, JSONCPP_OSTREAM* sout)
{
  sout_ = sout;
  addChildValues_ = false;
  indented_ = true;
  indentString_.clear();
  writeCommentBeforeValue(root);
  if (!indented_) writeIndent();
  indented_ = true;
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *sout_ << endingLineFeedSymbol_;
  sout_ = NULL;
  return 0;
}